

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QList<QDockWidget_*> *
allMyDockWidgets(QList<QDockWidget_*> *__return_storage_ptr__,QWidget *mainWindow)

{
  QObject *pQVar1;
  QDockWidget *pQVar2;
  long lVar3;
  long in_RDX;
  long lVar4;
  long in_FS_OFFSET;
  QDockWidget *local_40;
  QList<QDockWidget_*> *local_38;
  
  local_38 = *(QList<QDockWidget_*> **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QDockWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (in_RDX != 0) {
    pQVar1 = &mainWindow->super_QObject;
    do {
      pQVar2 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
      if (pQVar2 == (QDockWidget *)0x0) {
        lVar3 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
        if ((lVar3 != 0) && (lVar3 = *(long *)(*(long *)(lVar3 + 8) + 0x28), lVar3 != 0)) {
          lVar4 = 0;
          do {
            pQVar2 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
            if (pQVar2 != (QDockWidget *)0x0) {
              local_40 = pQVar2;
              QtPrivate::QPodArrayOps<QDockWidget*>::emplace<QDockWidget*&>
                        ((QPodArrayOps<QDockWidget*> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,&local_40);
              QList<QDockWidget_*>::end(__return_storage_ptr__);
            }
            lVar4 = lVar4 + 8;
          } while (lVar3 << 3 != lVar4);
        }
      }
      else {
        local_40 = pQVar2;
        QtPrivate::QPodArrayOps<QDockWidget*>::emplace<QDockWidget*&>
                  ((QPodArrayOps<QDockWidget*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_40);
        QList<QDockWidget_*>::end(__return_storage_ptr__);
      }
      mainWindow = (QWidget *)&mainWindow->field_0x8;
    } while (mainWindow != (QWidget *)(pQVar1 + in_RDX * 8));
  }
  if (*(QList<QDockWidget_*> **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QList<QDockWidget_*> **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QList<QDockWidget*> allMyDockWidgets(const QWidget *mainWindow)
{
    QList<QDockWidget*> result;
    for (QObject *c : mainWindow->children()) {
        if (auto *dw = qobject_cast<QDockWidget*>(c)) {
            result.append(dw);
        } else if (auto *gw = qobject_cast<QDockWidgetGroupWindow*>(c)) {
            for (QObject *c : gw->children()) {
                if (auto *dw = qobject_cast<QDockWidget*>(c))
                    result.append(dw);
            }
        }
    }

    return result;
}